

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O2

ComplexPair * __thiscall
Iir::BandPassTransform::transform
          (ComplexPair *__return_storage_ptr__,BandPassTransform *this,complex_t c)

{
  double in_XMM0_Qa;
  undefined8 uVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  double in_XMM1_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  if (INFINITY <= in_XMM0_Qa) {
    dVar3 = 0.0;
    if ((in_XMM1_Qa == 0.0) && (!NAN(in_XMM1_Qa))) {
      *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).first._M_value =
           0xbff0000000000000;
      *(undefined8 *)((__return_storage_ptr__->super_complex_pair_t).first._M_value + 8) = 0;
      uVar1 = 0x3ff0000000000000;
      goto LAB_00106335;
    }
  }
  local_58 = in_XMM0_Qa + 1.0;
  dVar2 = -in_XMM1_Qa;
  local_68 = 1.0 - in_XMM0_Qa;
  local_60 = dVar2;
  std::operator/((complex<double> *)&local_58,(complex<double> *)&local_68);
  dVar3 = (this->a2 + -1.0) * this->b2;
  dVar4 = (dVar3 + 1.0) * 4.0;
  local_50 = dVar4 * dVar2 + 0.0;
  local_58 = (dVar3 + -1.0) * 8.0 + extraout_XMM0_Qa * dVar4 + 0.0;
  local_38 = extraout_XMM0_Qa;
  local_30 = dVar2;
  std::complex<double>::operator*=((complex<double> *)&local_58,(complex<double> *)&local_38);
  local_58 = ((this->a2 + -1.0) * this->b2 + 1.0) * 4.0 + local_58;
  std::sqrt<double>((complex<double> *)&local_58);
  dVar3 = this->ab_2;
  local_68 = (dVar3 * local_38 - extraout_XMM0_Qa_00) + dVar3;
  local_58 = dVar3 * local_38 + extraout_XMM0_Qa_00 + dVar3;
  local_60 = dVar3 * local_30 - dVar2;
  local_50 = dVar3 * local_30 + dVar2;
  dVar2 = this->b + -1.0;
  dVar2 = dVar2 + dVar2;
  dVar4 = dVar2 * local_30 + 0.0;
  dVar3 = this->b + 1.0;
  local_48 = dVar3 + dVar3 + local_38 * dVar2 + 0.0;
  local_40 = dVar4;
  std::operator/((complex<double> *)&local_68,(complex<double> *)&local_48);
  dVar3 = dVar4;
  std::operator/((complex<double> *)&local_58,(complex<double> *)&local_48);
  *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).first._M_value = extraout_XMM0_Qa_01
  ;
  *(double *)((__return_storage_ptr__->super_complex_pair_t).first._M_value + 8) = dVar4;
  uVar1 = extraout_XMM0_Qa_02;
LAB_00106335:
  *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).second._M_value = uVar1;
  *(double *)((__return_storage_ptr__->super_complex_pair_t).second._M_value + 8) = dVar3;
  return __return_storage_ptr__;
}

Assistant:

ComplexPair BandPassTransform::transform (complex_t c)
{
	if (c == infinity())
		return ComplexPair (-1, 1);
	
	c = (1. + c) / (1. - c); // bilinear
	
	complex_t v = 0;
	v = addmul (v, 4 * (b2 * (a2 - 1) + 1), c);
	v += 8 * (b2 * (a2 - 1) - 1);
	v *= c;
	v += 4 * (b2 * (a2 - 1) + 1);
	v = std::sqrt (v);
	
	complex_t u = -v;
	u = addmul (u, ab_2, c);
	u += ab_2;
	
	v = addmul (v, ab_2, c);
	v += ab_2;
	
	complex_t d = 0;
	d = addmul (d, 2 * (b - 1), c) + 2 * (1 + b);
	
	return ComplexPair (u/d, v/d);
}